

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall ExprVisitorTest_VisitCount_Test::TestBody(ExprVisitorTest_VisitCount_Test *this)

{
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  other;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_01;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_02;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  value;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> value_00;
  bool bVar1;
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>)>
  *message;
  MockUnhandledVisitor *this_00;
  StrictMock<MockUnhandledVisitor> visitor;
  UnsupportedError *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  NumericExpr base;
  CountExpr e;
  BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_00000448;
  ExprBase in_stack_00000450;
  Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_fffffffffffffd78;
  MockVisitor *in_stack_fffffffffffffd80;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  Kind in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd9c;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  Type in_stack_fffffffffffffdac;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  CStringRef in_stack_fffffffffffffdb8;
  Kind in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar2;
  AssertHelper *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>)>
  *in_stack_fffffffffffffe90;
  BasicCStringRef<char> local_a0;
  string local_98 [32];
  AssertionResult local_78;
  undefined8 local_60;
  Impl *local_50;
  undefined8 local_48;
  BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> local_30;
  Impl *local_10;
  
  local_30.super_ExprBase.impl_ =
       (ExprBase)ExprVisitorTest::MakeCount((ExprVisitorTest *)in_stack_fffffffffffffdb8.data_);
  value.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffdc4;
  value.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffdc0;
  local_10 = (Impl *)local_30.super_ExprBase.impl_;
  testing::
  Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  ::Matcher((Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
             *)in_stack_fffffffffffffdb8.data_,value);
  message = MockVisitor::gmock_VisitCount
                      (in_stack_fffffffffffffd80,
                       (Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
                        *)in_stack_fffffffffffffd78);
  testing::internal::
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>)>
  ::InternalExpectedAt
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  testing::
  Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  ::~Matcher((Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
              *)0x13d913);
  local_50 = local_10;
  uVar2 = 0;
  other.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd94;
  other.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd88,other,
             (type_conflict)((ulong)in_stack_fffffffffffffd80 >> 0x20));
  local_60 = local_48;
  other_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd94;
  other_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd88,other_00,
             (type_conflict)((ulong)in_stack_fffffffffffffd80 >> 0x20));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)in_stack_00000448
             ,(Expr)in_stack_00000450.impl_);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_a0,"unsupported: {}");
    in_stack_fffffffffffffdc0 = mp::internal::ExprBase::kind((ExprBase *)0x13d9d9);
    in_stack_fffffffffffffdb8.data_ = mp::expr::str(in_stack_fffffffffffffd94);
    fmt::format<char_const*>
              (in_stack_fffffffffffffdb8,
               (char **)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    in_stack_fffffffffffffdb7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffdb7) {
      testing::StrictMock<NullVisitor>::StrictMock
                ((StrictMock<NullVisitor> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      other_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd94;
      other_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd90;
      mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_fffffffffffffd88,other_01,
                 (type_conflict)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 in_stack_00000448,(Expr)in_stack_00000450.impl_);
      testing::StrictMock<NullVisitor>::~StrictMock
                ((StrictMock<NullVisitor> *)in_stack_fffffffffffffd80);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               (char (*) [127])CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::__cxx11::string::~string(local_98);
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  this_00 = (MockUnhandledVisitor *)
            testing::AssertionResult::failure_message((AssertionResult *)0x13dd6f);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
             (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe00,(Message *)message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  testing::Message::~Message((Message *)0x13ddcc);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13de24);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  value_00.super_ExprBase.impl_._4_4_ = uVar2;
  value_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffdc0;
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
             in_stack_fffffffffffffdb8.data_,value_00);
  MockUnhandledVisitor::gmock_VisitNumeric(this_00,in_stack_fffffffffffffd78);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)>::
  InternalExpectedAt((MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                     in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::~Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)0x13dea5);
  other_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd94;
  other_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd90;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd88,other_02,(type_conflict)((ulong)this_00 >> 0x20));
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            (in_stack_00000448,(Expr)in_stack_00000450.impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)this_00);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitCount) {
  auto e = MakeCount();
  EXPECT_CALL(visitor_, VisitCount(e));
  mp::NumericExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_NUMERIC(base);
}